

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  UnitTestImpl *pUVar5;
  undefined8 extraout_RAX;
  char *pcVar6;
  TestRole TVar7;
  ostream *poVar8;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_70;
  int local_6c;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  allocator local_21;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                       ,0x344);
    Message::Message((Message *)&local_48);
    poVar8 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
    std::operator<<(poVar8,"Death tests use fork(), which is unsafe particularly");
    std::operator<<(poVar8," in a threaded context. For this test, ");
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),"Google Test");
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10)," ");
    poVar8 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
    if (sVar3 == 0) {
      pcVar6 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar8,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_48._M_dataplus._M_p + 0x10));
      poVar8 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
      pcVar6 = " threads.";
    }
    std::operator<<(poVar8,pcVar6);
    StringStreamToString((string *)pipe_fd,(stringstream *)local_48._M_dataplus._M_p);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
    std::operator<<((ostream *)&std::cerr,(string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    GTestLog::~GTestLog((GTestLog *)&local_90);
  }
  iVar1 = pipe(&local_70);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_d0,"CHECK failed: File ",(allocator *)&local_28);
    std::operator+(&local_f0,&local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_110,&local_f0,", line ");
    local_130._M_dataplus._M_p._0_4_ = 0x348;
    StreamableToString<int>(&local_b0,(int *)&local_130);
    std::operator+(&local_90,&local_110,&local_b0);
    std::operator+(&local_48,&local_90,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                   &local_48,"pipe(pipe_fd) != -1");
    DeathTestAbort((string *)pipe_fd);
  }
  else {
    std::__cxx11::string::string((string *)pipe_fd,"",(allocator *)&local_48);
    DeathTest::set_last_death_test_message((string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    CaptureStderr();
    FlushInfoLog();
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var2;
      if (_Var2 == 0) {
        TVar7 = EXECUTE_TEST;
        do {
          iVar1 = close(local_70);
          if (iVar1 != -1) goto LAB_001318b5;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string((string *)&local_b0,"CHECK failed: File ",&local_21);
        std::operator+(&local_d0,&local_b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_f0,&local_d0,", line ");
        local_28 = 0x359;
        StreamableToString<int>(&local_130,&local_28);
        std::operator+(&local_110,&local_f0,&local_130);
        std::operator+(&local_90,&local_110,": ");
        std::operator+(&local_48,&local_90,"close(pipe_fd[0])");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       &local_48," != -1");
        DeathTestAbort((string *)pipe_fd);
LAB_001318b5:
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_6c;
        pUVar5 = GetUnitTestImpl();
        ((pUVar5->listeners_).repeater_)->forwarding_enabled_ = false;
        g_in_fast_death_test_child = 1;
      }
      else {
        do {
          iVar1 = close(local_6c);
          if (iVar1 != -1) goto LAB_001317bb;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string((string *)&local_b0,"CHECK failed: File ",&local_21);
        std::operator+(&local_d0,&local_b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_f0,&local_d0,", line ");
        local_28 = 0x365;
        StreamableToString<int>(&local_130,&local_28);
        std::operator+(&local_110,&local_f0,&local_130);
        std::operator+(&local_90,&local_110,": ");
        std::operator+(&local_48,&local_90,"close(pipe_fd[1])");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       &local_48," != -1");
        DeathTestAbort((string *)pipe_fd);
LAB_001317bb:
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_70;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar7 = OVERSEE_TEST;
      }
      return TVar7;
    }
  }
  std::__cxx11::string::string((string *)&local_d0,"CHECK failed: File ",(allocator *)&local_28);
  std::operator+(&local_f0,&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_110,&local_f0,", line ");
  local_130._M_dataplus._M_p._0_4_ = 0x356;
  StreamableToString<int>(&local_b0,(int *)&local_130);
  std::operator+(&local_90,&local_110,&local_b0);
  std::operator+(&local_48,&local_90,": ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                 &local_48,"child_pid != -1");
  DeathTestAbort((string *)pipe_fd);
  std::__cxx11::string::~string((string *)pipe_fd);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}